

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O1

void __thiscall
Assembler::symbolTableEntry::symbolTableEntry
          (symbolTableEntry *this,string *symbolName,int section,int value,bool isGlobal,int size)

{
  int iVar1;
  
  (this->symbolName)._M_dataplus._M_p = (pointer)&(this->symbolName).field_2;
  (this->symbolName)._M_string_length = 0;
  (this->symbolName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->section = section;
  this->value = value;
  this->isGlobal = isGlobal;
  iVar1 = generateId + 1;
  this->id = generateId;
  generateId = iVar1;
  this->size = size;
  return;
}

Assistant:

symbolTableEntry(string symbolName = "", int section = -2, int value = -2, bool isGlobal = false,
                         int size = 0) {
            this->symbolName = symbolName;
            this->section = section;
            this->value = value;
            this->isGlobal = isGlobal;
            this->id = generateId++;
            this->size = size;

        }